

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_schemas.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DuckDBSchemasBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  LogicalType local_70;
  LogicalType local_58;
  LogicalType local_40;
  
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [4])0x1df7012);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [14])"database_name");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"database_oid");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])0x1e18122);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [8])0x1ef46be);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [5])"tags");
  LogicalType::LogicalType(&local_58,VARCHAR);
  LogicalType::LogicalType(&local_70,VARCHAR);
  LogicalType::MAP(&local_40,&local_58,&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
             &local_40);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType(&local_70);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])0x1dfca28);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [4])0x1df2ea0);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DuckDBSchemasBind(ClientContext &context, TableFunctionBindInput &input,
                                                  vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("oid");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("database_name");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("database_oid");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("schema_name");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("comment");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("tags");
	return_types.emplace_back(LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR));

	names.emplace_back("internal");
	return_types.emplace_back(LogicalType::BOOLEAN);

	names.emplace_back("sql");
	return_types.emplace_back(LogicalType::VARCHAR);

	return nullptr;
}